

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_STATUS ref_search_home(REF_SEARCH ref_search,REF_INT child,REF_INT parent)

{
  int *piVar1;
  REF_STATUS RVar2;
  REF_INT *pRVar3;
  char *pcVar4;
  double dVar5;
  double dVar6;
  undefined8 uStack_50;
  REF_DBL right_distance;
  REF_DBL left_distance;
  REF_DBL child_distance;
  
  if (child == -1) {
    pcVar4 = "empty child";
    uStack_50 = 0x51;
  }
  else {
    if (parent != -1) {
      if (child == parent) {
        return 0;
      }
      ref_search_distance(ref_search,child,parent,&child_distance);
      dVar5 = ref_search->children_ball[parent];
      dVar6 = child_distance + ref_search->radius[child];
      if (dVar5 <= dVar6) {
        dVar5 = dVar6;
      }
      ref_search->children_ball[parent] = dVar5;
      pRVar3 = ref_search->left;
      piVar1 = pRVar3 + parent;
      if ((*piVar1 != -1) && (pRVar3 = ref_search->right, pRVar3[parent] != -1)) {
        ref_search_distance(ref_search,child,*piVar1,&left_distance);
        ref_search_distance(ref_search,child,ref_search->right[parent],&right_distance);
        if (right_distance <= left_distance) {
          RVar2 = ref_search_home(ref_search,child,ref_search->right[parent]);
          if (RVar2 == 0) {
            return 0;
          }
          pcVar4 = "recursively add to right child";
          uStack_50 = 0x72;
        }
        else {
          RVar2 = ref_search_home(ref_search,child,ref_search->left[parent]);
          if (RVar2 == 0) {
            return 0;
          }
          pcVar4 = "recursively add to left child";
          uStack_50 = 0x6f;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               uStack_50,"ref_search_home",1,pcVar4);
        return 1;
      }
      pRVar3[parent] = child;
      return 0;
    }
    pcVar4 = "empty parent";
    uStack_50 = 0x52;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
         uStack_50,"ref_search_home",pcVar4);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_search_home(REF_SEARCH ref_search, REF_INT child,
                                          REF_INT parent) {
  REF_DBL child_distance;
  REF_DBL left_distance, right_distance;

  RUS(REF_EMPTY, child, "empty child");
  RUS(REF_EMPTY, parent, "empty parent");

  /* done, don't add self to children */
  if (child == parent) return REF_SUCCESS;

  RSS(ref_search_distance(ref_search, child, parent, &child_distance), "d");
  ref_search->children_ball[parent] =
      MAX(ref_search->children_ball[parent],
          child_distance + ref_search->radius[child]);

  if (REF_EMPTY == ref_search->left[parent]) {
    ref_search->left[parent] = child;
    return REF_SUCCESS;
  }

  if (REF_EMPTY == ref_search->right[parent]) {
    ref_search->right[parent] = child;
    return REF_SUCCESS;
  }

  RSS(ref_search_distance(ref_search, child, ref_search->left[parent],
                          &left_distance),
      "left dist");
  RSS(ref_search_distance(ref_search, child, ref_search->right[parent],
                          &right_distance),
      "right dist");

  if (left_distance < right_distance) {
    RSS(ref_search_home(ref_search, child, ref_search->left[parent]),
        "recursively add to left child");
  } else {
    RSS(ref_search_home(ref_search, child, ref_search->right[parent]),
        "recursively add to right child");
  }

  return REF_SUCCESS;
}